

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O0

int mp_toradix(mp_int *a,char *str,int radix)

{
  int in_EDX;
  mp_int *in_RSI;
  mp_digit *in_RDI;
  mp_digit unaff_retaddr;
  char *_s;
  mp_digit d;
  mp_int t;
  int digs;
  int res;
  mp_int *a_00;
  mp_int *in_stack_ffffffffffffffb8;
  int local_40;
  int local_38;
  int local_24;
  mp_int *local_18;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if ((in_EDX < 2) || (0x40 < in_EDX)) {
    iVar1 = -3;
  }
  else if ((int)*in_RDI == 0) {
    *(undefined1 *)&in_RSI->used = 0x30;
    *(undefined1 *)((long)&in_RSI->used + 1) = 0;
    iVar1 = 0;
  }
  else {
    a_00 = in_RSI;
    iVar1 = mp_init_copy(in_stack_ffffffffffffffb8,in_RSI);
    if (iVar1 == 0) {
      local_18 = in_RSI;
      if (local_38 == 1) {
        a_00 = (mp_int *)((long)&a_00->used + 1);
        local_18 = (mp_int *)((long)&in_RSI->used + 1);
        *(undefined1 *)&in_RSI->used = 0x2d;
      }
      local_24 = 0;
      while (local_40 != 0) {
        iVar1 = mp_div_d((mp_int *)_s,unaff_retaddr,
                         (mp_int *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         in_RDI);
        if (iVar1 != 0) {
          mp_clear(a_00);
          return iVar1;
        }
        *(char *)&local_18->used = mp_s_rmap[(long)in_stack_ffffffffffffffb8];
        local_24 = local_24 + 1;
        local_18 = (mp_int *)((long)&local_18->used + 1);
      }
      bn_reverse((uchar *)a_00,local_24);
      *(undefined1 *)&local_18->used = 0;
      mp_clear(a_00);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int mp_toradix (mp_int * a, char *str, int radix)
{
  int     res, digs;
  mp_int  t;
  mp_digit d;
  char   *_s = str;

  /* check range of the radix */
  if (radix < 2 || radix > 64) {
    return MP_VAL;
  }

  /* quick out if its zero */
  if (mp_iszero(a) == 1) {
     *str++ = '0';
     *str = '\0';
     return MP_OKAY;
  }

  if ((res = mp_init_copy (&t, a)) != MP_OKAY) {
    return res;
  }

  /* if it is negative output a - */
  if (t.sign == MP_NEG) {
    ++_s;
    *str++ = '-';
    t.sign = MP_ZPOS;
  }

  digs = 0;
  while (mp_iszero (&t) == 0) {
    if ((res = mp_div_d (&t, (mp_digit) radix, &t, &d)) != MP_OKAY) {
      mp_clear (&t);
      return res;
    }
    *str++ = mp_s_rmap[d];
    ++digs;
  }

  /* reverse the digits of the string.  In this case _s points
   * to the first digit [exluding the sign] of the number]
   */
  bn_reverse ((unsigned char *)_s, digs);

  /* append a NULL so the string is properly terminated */
  *str = '\0';

  mp_clear (&t);
  return MP_OKAY;
}